

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-simple.c
# Opt level: O1

void host_ui_event(HostUI *ui,SDL_Event *event)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int ih;
  int iw;
  int local_20;
  int local_1c;
  
  if ((event->type == 0x200) && (((event->display).event | 4) == 5)) {
    SDL_GL_GetDrawableSize(ui->window,&local_1c,&local_20);
    fVar2 = (float)local_1c;
    fVar3 = (float)local_20;
    fVar5 = (float)ui->width / (float)ui->height;
    uVar1 = -(uint)(fVar2 / fVar3 < fVar5);
    fVar4 = (float)(~uVar1 & (uint)(fVar5 * fVar3) | uVar1 & (uint)fVar2);
    fVar6 = fVar3;
    if (fVar2 / fVar3 < fVar5) {
      fVar6 = fVar2 / fVar5;
    }
    glViewport((int)((fVar2 - fVar4) * 0.5),(int)((fVar3 - fVar6) * 0.5),(int)fVar4,(int)fVar6);
  }
  return;
}

Assistant:

void host_ui_event(struct HostUI* ui, union SDL_Event* event) {
  if (event->type == SDL_WINDOWEVENT &&
      (event->window.event == SDL_WINDOWEVENT_SHOWN ||
       event->window.event == SDL_WINDOWEVENT_RESIZED)) {
    int iw, ih;
    SDL_GL_GetDrawableSize(ui->window, &iw, &ih);
    f32 w = iw, h = ih;
    f32 aspect = w / h;
    f32 want_aspect = (f32)ui->width / ui->height;
    f32 new_w = aspect < want_aspect ? w : h * want_aspect;
    f32 new_h = aspect < want_aspect ? w / want_aspect : h;
    f32 new_left = (w - new_w) * 0.5f;
    f32 new_top = (h - new_h) * 0.5f;
    glViewport(new_left, new_top, new_w, new_h);
  }
}